

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SliceStaticLayerParams::InternalSwap
          (SliceStaticLayerParams *this,SliceStaticLayerParams *other)

{
  int iVar1;
  
  google::protobuf::RepeatedField<long>::InternalSwap(&this->beginids_,&other->beginids_);
  google::protobuf::RepeatedField<bool>::InternalSwap(&this->beginmasks_,&other->beginmasks_);
  google::protobuf::RepeatedField<long>::InternalSwap(&this->endids_,&other->endids_);
  google::protobuf::RepeatedField<bool>::InternalSwap(&this->endmasks_,&other->endmasks_);
  google::protobuf::RepeatedField<long>::InternalSwap(&this->strides_,&other->strides_);
  google::protobuf::RepeatedField<bool>::InternalSwap(&this->squeezemasks_,&other->squeezemasks_);
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void SliceStaticLayerParams::InternalSwap(SliceStaticLayerParams* other) {
  beginids_.InternalSwap(&other->beginids_);
  beginmasks_.InternalSwap(&other->beginmasks_);
  endids_.InternalSwap(&other->endids_);
  endmasks_.InternalSwap(&other->endmasks_);
  strides_.InternalSwap(&other->strides_);
  squeezemasks_.InternalSwap(&other->squeezemasks_);
  std::swap(_cached_size_, other->_cached_size_);
}